

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O3

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::VarBndWriter>
          (NLW2_NLFeeder_C_Impl *this,VarBndWriter *vbw)

{
  VarBndWriter *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  local_20 = 0;
  local_10 = std::
             _Function_handler<void_(double,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:213:11)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(double,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:213:11)>
             ::_M_manager;
  local_28 = vbw;
  (*(this->nlf2_c_).FeedVarBounds)((this->nlf2_c_).p_user_data_,&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void FeedVarBounds(VarBoundsWriter& vbw) {
    assert(NLF().FeedVarBounds);
    std::function<void(double, double)> vbwc
        = [&vbw](double i, double v){
      vbw.WriteLbUb(i, v);
    };
    NLF().FeedVarBounds(NLF().p_user_data_, &vbwc);
  }